

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall FHealthBar::SetVial(FHealthBar *this,int level)

{
  int iVar1;
  
  if (level < 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 200;
    if ((uint)level < 200) {
      iVar1 = level;
    }
    if (level == 999) {
      iVar1 = level;
    }
  }
  if (this->VialLevel != iVar1) {
    this->VialLevel = iVar1;
    this->NeedRefresh = true;
  }
  return;
}

Assistant:

void FHealthBar::SetVial (int level)
{
	if (level < 0)
	{
		level = 0;
	}
	else if (level > 200 && level != 999)
	{
		level = 200;
	}
	if (VialLevel != level)
	{
		VialLevel = level;
		NeedRefresh = true;
	}
}